

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

bool __thiscall cmMakefile::ReadListFile(cmMakefile *this,string *filename)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  bool bVar3;
  string *in_base;
  ListFileScope scope;
  string filenametoread;
  cmListFile listFile;
  ListFileScope LStack_88;
  string local_78;
  cmListFile local_58;
  
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&local_58,&this->StateSnapshot);
  in_base = cmStateDirectory::GetCurrentSource_abi_cxx11_((cmStateDirectory *)&local_58);
  cmsys::SystemTools::CollapseFullPath(&local_78,filename,in_base);
  ListFileScope::ListFileScope(&LStack_88,this,&local_78);
  paVar1 = &local_58.Filename.field_2;
  local_58.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.Filename._M_string_length = 0;
  local_58.Filename.field_2._M_local_buf[0] = '\0';
  local_58.Filename._M_dataplus._M_p = (pointer)paVar1;
  bVar2 = cmListFile::ParseFile
                    (&local_58,local_78._M_dataplus._M_p,
                     (this->GlobalGenerator->CMakeInstance->Messenger)._M_t.
                     super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
                     super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
                     super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl,&this->Backtrace);
  if (bVar2) {
    ReadListFile(this,&local_58,&local_78);
    if (cmSystemTools::s_FatalErrorOccured == false) {
      bVar3 = cmSystemTools::GetInterruptFlag();
      if (!bVar3) goto LAB_00144e5f;
    }
    LStack_88.ReportError = false;
  }
LAB_00144e5f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.Filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.Filename._M_dataplus._M_p,
                    CONCAT71(local_58.Filename.field_2._M_allocated_capacity._1_7_,
                             local_58.Filename.field_2._M_local_buf[0]) + 1);
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::~vector(&local_58.Functions)
  ;
  ListFileScope::~ListFileScope(&LStack_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool cmMakefile::ReadListFile(const std::string& filename)
{
  std::string filenametoread = cmSystemTools::CollapseFullPath(
    filename, this->GetCurrentSourceDirectory());

  ListFileScope scope(this, filenametoread);

  cmListFile listFile;
  if (!listFile.ParseFile(filenametoread.c_str(), this->GetMessenger(),
                          this->Backtrace)) {
    return false;
  }

  this->ReadListFile(listFile, filenametoread);
  if (cmSystemTools::GetFatalErrorOccured()) {
    scope.Quiet();
  }
  return true;
}